

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexCachedReader::ref(PtexCachedReader *this)

{
  int iVar1;
  bool bVar2;
  int32_t oldCount;
  PtexCachedReader *this_local;
  
  do {
    do {
      iVar1 = this->_refCount;
    } while (iVar1 < 0);
    LOCK();
    bVar2 = iVar1 == this->_refCount;
    if (bVar2) {
      this->_refCount = iVar1 + 1;
    }
    UNLOCK();
  } while (!bVar2);
  return;
}

Assistant:

void ref() {
        while (1) {
            int32_t oldCount = _refCount;
            if (oldCount >= 0 && AtomicCompareAndSwap(&_refCount, oldCount, oldCount+1))
                return;
        }
    }